

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

DoublePrecision
ga_ddot_patch_(Integer *g_a,char *t_a,Integer *ailo,Integer *aihi,Integer *ajlo,Integer *ajhi,
              Integer *g_b,char *t_b,Integer *bilo,Integer *bihi,Integer *bjlo,Integer *bjhi,
              int alen,int blen)

{
  Integer *in_RCX;
  Integer *in_RDX;
  Integer unaff_RBX;
  Integer *in_RSI;
  char *in_RDI;
  Integer *in_R8;
  Integer unaff_R14;
  char *unaff_R15;
  Integer *unaff_retaddr;
  Integer *in_stack_00000008;
  Integer *in_stack_00000010;
  Integer *in_stack_00000018;
  void *in_stack_00000020;
  Integer btype;
  Integer atype;
  DoublePrecision retval;
  Integer in_stack_000000f8;
  char *in_stack_00000100;
  Integer *in_stack_00000158;
  Integer in_stack_00000160;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  
  pnga_inquire_type(in_stack_00000160,in_stack_00000158);
  pnga_inquire_type(in_stack_00000160,in_stack_00000158);
  if ((local_60 != local_68) || (local_60 != 0x3ec)) {
    pnga_error(in_stack_00000100,in_stack_000000f8);
  }
  sga_dot_patch(unaff_RBX,in_RDI,in_RSI,in_RDX,in_RCX,in_R8,unaff_R14,unaff_R15,unaff_retaddr,
                in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020);
  return local_58;
}

Assistant:

DoublePrecision ga_ddot_patch_(Integer *g_a, char *t_a, int alen, Integer *ailo, Integer *aihi, Integer *ajlo, Integer *ajhi, Integer *g_b, char *t_b, int blen, Integer *bilo, Integer *bihi, Integer *bjlo, Integer *bjhi)
#endif
{
    DoublePrecision retval;
    Integer atype, btype;

    pnga_inquire_type(*g_a, &atype);
    pnga_inquire_type(*g_b, &btype);
    if (atype != btype || atype != C_DBL) pnga_error(" wrong types ", 0L);
    sga_dot_patch(*g_a, t_a, ailo, aihi, ajlo, ajhi, *g_b, t_b, bilo, bihi, bjlo, bjhi, &retval);

    return retval;
}